

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::Formatter::formatFuncValuePack
                (String *sb,uint32_t formatFlags,BaseEmitter *emitter,FuncValuePack *pack,
                VirtReg **vRegs)

{
  VirtReg *pVVar1;
  uint32_t uVar2;
  Error EVar3;
  FuncValue *pFVar4;
  size_t index;
  uint32_t uVar5;
  int local_54;
  BaseEmitter *local_50;
  ulong local_48;
  FuncValuePack *local_40;
  char *local_38;
  
  local_50 = emitter;
  local_40 = pack;
  uVar2 = FuncValuePack::count(pack);
  if (uVar2 == 0) {
    EVar3 = String::append(sb,"void",0xffffffffffffffff);
    return EVar3;
  }
  if (uVar2 != 1) {
    String::append(sb,'[');
  }
  local_48 = (ulong)uVar2;
  for (index = 0; local_48 != index; index = index + 1) {
    pFVar4 = FuncValuePack::operator[](local_40,index);
    uVar5 = pFVar4->_data;
    if (uVar5 == 0) break;
    if (index != 0) {
      EVar3 = String::append(sb,", ",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      uVar5 = pFVar4->_data;
    }
    EVar3 = formatTypeId(sb,uVar5 & 0xff);
    if (EVar3 != 0) {
      return EVar3;
    }
    if ((uVar5 & 0x300) != 0) {
      EVar3 = String::append(sb,'@');
      if (EVar3 != 0) {
        return EVar3;
      }
      if (((uVar5 >> 10 & 1) != 0) && (EVar3 = String::append(sb,'['), EVar3 != 0)) {
        return EVar3;
      }
      if (((uVar5 >> 8 & 1) != 0) &&
         (EVar3 = formatRegister(sb,formatFlags,local_50,(uint)(local_50->_environment)._arch,
                                 uVar5 >> 0x18,uVar5 >> 0x10 & 0xff), EVar3 != 0)) {
        return EVar3;
      }
      if ((uVar5 >> 9 & 1) != 0) {
        local_54 = (int)uVar5 >> 0xc;
        EVar3 = String::appendFormat<int>(sb,"[%d]",&local_54);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      if (((uVar5 >> 10 & 1) != 0) && (EVar3 = String::append(sb,']'), EVar3 != 0)) {
        return EVar3;
      }
    }
    if (vRegs != (VirtReg **)0x0) {
      pVVar1 = vRegs[index];
      local_38 = "<none>";
      if (pVVar1 != (VirtReg *)0x0) {
        if (*(uint *)&(pVVar1->_name).field_0 < 0xc) {
          local_38 = (char *)((long)&(pVVar1->_name).field_0 + 4);
        }
        else {
          local_38 = *(char **)((long)&(pVVar1->_name).field_0 + 8);
        }
      }
      EVar3 = String::appendFormat<char_const*>(sb," %s",&local_38);
      if (EVar3 != 0) {
        return EVar3;
      }
    }
  }
  if (uVar2 != 1) {
    String::append(sb,']');
  }
  return 0;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  uint32_t formatFlags,
  const BaseEmitter* emitter,
  const FuncValuePack& pack,
  VirtReg* const* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, emitter, value));

    if (vRegs) {
      static const char nullRet[] = "<none>";
      ASMJIT_PROPAGATE(sb.appendFormat(" %s", vRegs[valueIndex] ? vRegs[valueIndex]->name() : nullRet));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}